

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall drawPPTX::push_back(drawPPTX *this,baseObject *obj)

{
  bool bVar1;
  objectType oVar2;
  reference this_00;
  size_type sVar3;
  reference pvVar4;
  range rVar5;
  baseObject *it;
  iterator __end2;
  iterator __begin2;
  vector<baseObject,_std::allocator<baseObject>_> *__range2;
  double local_30;
  double local_28;
  double local_20;
  baseObject *obj_local;
  drawPPTX *this_local;
  
  std::vector<baseObject,_std::allocator<baseObject>_>::push_back(&this->objects,obj);
  oVar2 = baseObject::getType(obj);
  if (oVar2 == OBJECT_CURVES) {
    rVar5 = baseObject::getRangeX(obj);
    local_28 = rVar5.min;
    (this->rangeX).min = local_28;
    local_20 = rVar5.max;
    (this->rangeX).max = local_20;
    rVar5 = baseObject::getRangeY(obj);
    __range2 = (vector<baseObject,_std::allocator<baseObject>_> *)rVar5.min;
    (this->rangeY).min = (double)__range2;
    local_30 = rVar5.max;
    (this->rangeY).max = local_30;
  }
  else {
    __end2 = std::vector<baseObject,_std::allocator<baseObject>_>::begin(&this->objects);
    it = (baseObject *)std::vector<baseObject,_std::allocator<baseObject>_>::end(&this->objects);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<baseObject_*,_std::vector<baseObject,_std::allocator<baseObject>_>_>
                                       *)&it), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<baseObject_*,_std::vector<baseObject,_std::allocator<baseObject>_>_>
                ::operator*(&__end2);
      oVar2 = baseObject::getType(this_00);
      if (oVar2 == OBJECT_CURVES) {
        sVar3 = std::vector<baseObject,_std::allocator<baseObject>_>::size(&this->objects);
        pvVar4 = std::vector<baseObject,_std::allocator<baseObject>_>::operator[]
                           (&this->objects,sVar3 - 1);
        baseObject::setRangeX(pvVar4,&this->rangeX);
        sVar3 = std::vector<baseObject,_std::allocator<baseObject>_>::size(&this->objects);
        pvVar4 = std::vector<baseObject,_std::allocator<baseObject>_>::operator[]
                           (&this->objects,sVar3 - 1);
        baseObject::setRangeY(pvVar4,&this->rangeY);
      }
      __gnu_cxx::
      __normal_iterator<baseObject_*,_std::vector<baseObject,_std::allocator<baseObject>_>_>::
      operator++(&__end2);
    }
  }
  return;
}

Assistant:

void push_back(const baseObject& obj)
    {
        objects.push_back(obj);
        if (obj.getType() == OBJECT_CURVES)
        {
            rangeX = obj.getRangeX();
            rangeY = obj.getRangeY();
        }
        else
        {
            for (auto&& it : objects)
            {
                if (it.getType() == OBJECT_CURVES)
                {
                    objects[objects.size() - 1].setRangeX(rangeX);
                    objects[objects.size() - 1].setRangeY(rangeY);
                }
            }
        }
    }